

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void NavUpdateWindowingHighlightWindow(int focus_change_dir)

{
  long lVar1;
  ImGuiContext *pIVar2;
  ImGuiWindow *pIVar3;
  long lVar4;
  int i_start;
  long lVar5;
  ImGuiContext *g;
  
  pIVar2 = GImGui;
  pIVar3 = GImGui->NavWindowingTarget;
  if (pIVar3 == (ImGuiWindow *)0x0) {
    __assert_fail("g.NavWindowingTarget",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JacquesLucke[P]gate_sim/extern/imgui/imgui.cpp"
                  ,0x2279,"void NavUpdateWindowingHighlightWindow(int)");
  }
  if ((pIVar3->Flags & 0x8000000) == 0) {
    lVar4 = (long)(GImGui->WindowsFocusOrder).Size;
    do {
      if (lVar4 < 1) {
        lVar5 = 0xffffffff;
        break;
      }
      lVar5 = lVar4 + -1;
      lVar1 = lVar4 + -1;
      lVar4 = lVar5;
    } while ((GImGui->WindowsFocusOrder).Data[lVar1] != pIVar3);
    pIVar3 = FindWindowNavFocusable((int)lVar5 + focus_change_dir,-0x7fffffff,focus_change_dir);
    if (pIVar3 == (ImGuiWindow *)0x0) {
      i_start = 0;
      if (focus_change_dir < 0) {
        i_start = (pIVar2->WindowsFocusOrder).Size + -1;
      }
      pIVar3 = FindWindowNavFocusable(i_start,(int)lVar5,focus_change_dir);
    }
    if (pIVar3 != (ImGuiWindow *)0x0) {
      pIVar2->NavWindowingTargetAnim = pIVar3;
      pIVar2->NavWindowingTarget = pIVar3;
    }
    pIVar2->NavWindowingToggleLayer = false;
  }
  return;
}

Assistant:

static void NavUpdateWindowingHighlightWindow(int focus_change_dir)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(g.NavWindowingTarget);
    if (g.NavWindowingTarget->Flags & ImGuiWindowFlags_Modal)
        return;

    const int i_current = ImGui::FindWindowFocusIndex(g.NavWindowingTarget);
    ImGuiWindow* window_target = FindWindowNavFocusable(i_current + focus_change_dir, -INT_MAX, focus_change_dir);
    if (!window_target)
        window_target = FindWindowNavFocusable((focus_change_dir < 0) ? (g.WindowsFocusOrder.Size - 1) : 0, i_current, focus_change_dir);
    if (window_target) // Don't reset windowing target if there's a single window in the list
        g.NavWindowingTarget = g.NavWindowingTargetAnim = window_target;
    g.NavWindowingToggleLayer = false;
}